

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_fixed_suite::fixed_assign_iterator(void)

{
  basic_iterator<int> first_end;
  uint uVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_4UL> span;
  int array [4];
  allocator_type local_a1;
  vector<int,_std::allocator<int>_> local_a0;
  vector<int,_std::allocator<int>_> local_88;
  circular_view<int,4ul> *local_70;
  ulong uStack_68;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_60 = &local_38;
  local_38 = 0;
  uStack_30 = 0;
  local_58 = 0;
  local_50 = 4;
  local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_88,__l,(allocator_type *)&local_48);
  local_58 = 0;
  local_50 = 4;
  vista::circular_view<int,4ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,4ul> *)&local_60,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  local_48 = 0x160000000b;
  uStack_40 = 0x2c00000021;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l_00,&local_a1);
  first_begin.current._0_4_ = (uint)local_50 - (int)local_58 & 7;
  uVar1 = (uint)local_50 & 7;
  uStack_68 = (ulong)uVar1;
  first_end.current._0_4_ = uVar1;
  first_end.parent = (view_pointer)&local_60;
  first_end.current._4_4_ = 0;
  first_begin.parent = (view_pointer)&local_60;
  first_begin.current._4_4_ = 0;
  local_70 = (circular_view<int,4ul> *)&local_60;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x3ab,"void api_fixed_suite::fixed_assign_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fixed_assign_iterator()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    std::vector<int> input = {11, 22, 33, 44};
    span.assign(input.begin(), input.end());
    {
        std::vector<int> expect = {11, 22, 33, 44};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}